

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS
ref_import_bin_ugrid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename,REF_BOOL swap,REF_BOOL fat
          )

{
  uint uVar1;
  void *__ptr;
  size_t sVar2;
  undefined1 *puVar3;
  int local_100;
  int local_fc;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  char *yp;
  char *xp;
  double y;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *xyz;
  REF_INT ixyz;
  REF_INT chunk;
  REF_INT nread;
  REF_INT max_chunk;
  REF_INT new_node;
  REF_INT node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  FILE *file;
  REF_NODE ref_node;
  REF_GRID_conflict ref_grid;
  REF_BOOL fat_local;
  REF_BOOL swap_local;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID_conflict *ref_grid_ptr_local;
  
  ref_grid._0_4_ = fat;
  ref_grid._4_4_ = swap;
  _fat_local = filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    file = *(FILE **)&ref_node->blank;
    _ntri = fopen(_fat_local,"r");
    if (_ntri == (FILE *)0x0) {
      printf("unable to open %s\n",_fat_local);
    }
    if (_ntri == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x233,"ref_import_bin_ugrid","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      uVar1 = ref_import_bin_ugrid_chunk((FILE *)_ntri,ref_grid._4_4_,(REF_BOOL)ref_grid,1,&nqua);
      if (uVar1 == 0) {
        uVar1 = ref_import_bin_ugrid_chunk((FILE *)_ntri,ref_grid._4_4_,(REF_BOOL)ref_grid,1,&ntet);
        if (uVar1 == 0) {
          uVar1 = ref_import_bin_ugrid_chunk
                            ((FILE *)_ntri,ref_grid._4_4_,(REF_BOOL)ref_grid,1,&npyr);
          if (uVar1 == 0) {
            uVar1 = ref_import_bin_ugrid_chunk
                              ((FILE *)_ntri,ref_grid._4_4_,(REF_BOOL)ref_grid,1,&npri);
            if (uVar1 == 0) {
              uVar1 = ref_import_bin_ugrid_chunk
                                ((FILE *)_ntri,ref_grid._4_4_,(REF_BOOL)ref_grid,1,&nhex);
              if (uVar1 == 0) {
                uVar1 = ref_import_bin_ugrid_chunk
                                  ((FILE *)_ntri,ref_grid._4_4_,(REF_BOOL)ref_grid,1,&node);
                if (uVar1 == 0) {
                  uVar1 = ref_import_bin_ugrid_chunk
                                    ((FILE *)_ntri,ref_grid._4_4_,(REF_BOOL)ref_grid,1,&new_node);
                  if (uVar1 == 0) {
                    if (0 < *(int *)(filename_local + 0x30)) {
                      ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid header");
                    }
                    if (nqua < 0xf4241) {
                      local_fc = nqua;
                    }
                    else {
                      local_fc = 1000000;
                    }
                    if (local_fc * 3 < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x241,"ref_import_bin_ugrid","malloc xyz of REF_DBL negative");
                      ref_grid_ptr_local._4_4_ = 1;
                    }
                    else {
                      __ptr = malloc((long)(local_fc * 3) << 3);
                      if (__ptr == (void *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x241,"ref_import_bin_ugrid","malloc xyz of REF_DBL NULL");
                        ref_grid_ptr_local._4_4_ = 2;
                      }
                      else {
                        for (ixyz = 0; ixyz < nqua; ixyz = local_100 + ixyz) {
                          if (local_fc < nqua - ixyz) {
                            local_100 = local_fc;
                          }
                          else {
                            local_100 = nqua - ixyz;
                          }
                          sVar2 = fread(__ptr,8,(long)(local_100 * 3),_ntri);
                          if ((long)(local_100 * 3) != sVar2) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x246,"ref_import_bin_ugrid","xyz",(long)(local_100 * 3),sVar2);
                            return 1;
                          }
                          if (ref_grid._4_4_ != 0) {
                            for (xyz._4_4_ = 0;
                                SBORROW4(xyz._4_4_,local_100 * 3) != xyz._4_4_ + local_100 * -3 < 0;
                                xyz._4_4_ = xyz._4_4_ + 1) {
                              puVar3 = (undefined1 *)((long)__ptr + (long)xyz._4_4_ * 8);
                              xp._7_1_ = *puVar3;
                              xp._6_1_ = puVar3[1];
                              xp._5_1_ = puVar3[2];
                              xp._4_1_ = puVar3[3];
                              xp._3_1_ = puVar3[4];
                              xp._2_1_ = puVar3[5];
                              xp._1_1_ = puVar3[6];
                              xp._0_1_ = puVar3[7];
                              *(char **)((long)__ptr + (long)xyz._4_4_ * 8) = xp;
                            }
                          }
                          for (max_chunk = 0; max_chunk < local_100; max_chunk = max_chunk + 1) {
                            uVar1 = ref_node_add((REF_NODE)file,(long)(max_chunk + ixyz),&nread);
                            if (uVar1 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x24a,"ref_import_bin_ugrid",(ulong)uVar1,"new_node");
                              return uVar1;
                            }
                            *(undefined8 *)(file->_IO_buf_base + (long)(nread * 0xf) * 8) =
                                 *(undefined8 *)((long)__ptr + (long)(max_chunk * 3) * 8);
                            *(undefined8 *)(file->_IO_buf_base + (long)(nread * 0xf + 1) * 8) =
                                 *(undefined8 *)((long)__ptr + (long)(max_chunk * 3 + 1) * 8);
                            *(undefined8 *)(file->_IO_buf_base + (long)(nread * 0xf + 2) * 8) =
                                 *(undefined8 *)((long)__ptr + (long)(max_chunk * 3 + 2) * 8);
                          }
                        }
                        if (__ptr != (void *)0x0) {
                          free(__ptr);
                        }
                        uVar1 = ref_node_initialize_n_global((REF_NODE)file,(long)nqua);
                        if (uVar1 == 0) {
                          if (0 < *(int *)(filename_local + 0x30)) {
                            ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid node");
                          }
                          uVar1 = ref_import_bin_ugrid_c2n
                                            ((REF_CELL)ref_node->part,ntet,(FILE *)_ntri,
                                             ref_grid._4_4_,(REF_BOOL)ref_grid);
                          if (uVar1 == 0) {
                            uVar1 = ref_import_bin_ugrid_c2n
                                              (*(REF_CELL *)&ref_node->naux,npyr,(FILE *)_ntri,
                                               ref_grid._4_4_,(REF_BOOL)ref_grid);
                            if (uVar1 == 0) {
                              uVar1 = ref_import_bin_ugrid_bound_tag
                                                ((REF_CELL)ref_node->part,ntet,(FILE *)_ntri,
                                                 ref_grid._4_4_,(REF_BOOL)ref_grid);
                              if (uVar1 == 0) {
                                uVar1 = ref_import_bin_ugrid_bound_tag
                                                  (*(REF_CELL *)&ref_node->naux,npyr,(FILE *)_ntri,
                                                   ref_grid._4_4_,(REF_BOOL)ref_grid);
                                if (uVar1 == 0) {
                                  if (0 < *(int *)(filename_local + 0x30)) {
                                    ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid tri");
                                  }
                                  uVar1 = ref_import_bin_ugrid_c2n
                                                    ((REF_CELL)ref_node->ref_mpi,npri,(FILE *)_ntri,
                                                     ref_grid._4_4_,(REF_BOOL)ref_grid);
                                  if (uVar1 == 0) {
                                    if (0 < *(int *)(filename_local + 0x30)) {
                                      ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid tet");
                                    }
                                    uVar1 = ref_import_bin_ugrid_c2n
                                                      (*(REF_CELL *)&ref_node->n_unused,nhex,
                                                       (FILE *)_ntri,ref_grid._4_4_,
                                                       (REF_BOOL)ref_grid);
                                    if (uVar1 == 0) {
                                      if (0 < *(int *)(filename_local + 0x30)) {
                                        ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid pyr");
                                      }
                                      uVar1 = ref_import_bin_ugrid_c2n
                                                        ((REF_CELL)ref_node->unused_global,node,
                                                         (FILE *)_ntri,ref_grid._4_4_,
                                                         (REF_BOOL)ref_grid);
                                      if (uVar1 == 0) {
                                        if (0 < *(int *)(filename_local + 0x30)) {
                                          ref_mpi_stopwatch_stop
                                                    ((REF_MPI)filename_local,"ugrid pri");
                                        }
                                        uVar1 = ref_import_bin_ugrid_c2n
                                                          ((REF_CELL)ref_node->old_n_global,new_node
                                                           ,(FILE *)_ntri,ref_grid._4_4_,
                                                           (REF_BOOL)ref_grid);
                                        if (uVar1 == 0) {
                                          if (0 < *(int *)(filename_local + 0x30)) {
                                            ref_mpi_stopwatch_stop
                                                      ((REF_MPI)filename_local,"ugrid hex");
                                          }
                                          fclose(_ntri);
                                          ref_grid_ptr_local._4_4_ = 0;
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                                 ,0x26e,"ref_import_bin_ugrid",(ulong)uVar1,
                                                 "hex face nodes");
                                          ref_grid_ptr_local._4_4_ = uVar1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                               ,0x26b,"ref_import_bin_ugrid",(ulong)uVar1,
                                               "pri face nodes");
                                        ref_grid_ptr_local._4_4_ = uVar1;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                             ,0x268,"ref_import_bin_ugrid",(ulong)uVar1,
                                             "pyr face nodes");
                                      ref_grid_ptr_local._4_4_ = uVar1;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x265,"ref_import_bin_ugrid",(ulong)uVar1,
                                           "tet face nodes");
                                    ref_grid_ptr_local._4_4_ = uVar1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                         ,0x261,"ref_import_bin_ugrid",(ulong)uVar1,"tri face tags")
                                  ;
                                  ref_grid_ptr_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x25e,"ref_import_bin_ugrid",(ulong)uVar1,"tri face tags");
                                ref_grid_ptr_local._4_4_ = uVar1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x25a,"ref_import_bin_ugrid",(ulong)uVar1,"qua face nodes");
                              ref_grid_ptr_local._4_4_ = uVar1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,600,"ref_import_bin_ugrid",(ulong)uVar1,"tri face nodes");
                            ref_grid_ptr_local._4_4_ = uVar1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x253,"ref_import_bin_ugrid",(ulong)uVar1,"init glob");
                          ref_grid_ptr_local._4_4_ = uVar1;
                        }
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x23b,"ref_import_bin_ugrid",(ulong)uVar1,"nhex");
                    ref_grid_ptr_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x23a,"ref_import_bin_ugrid",(ulong)uVar1,"npri");
                  ref_grid_ptr_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x239,"ref_import_bin_ugrid",(ulong)uVar1,"npyr");
                ref_grid_ptr_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x238,"ref_import_bin_ugrid",(ulong)uVar1,"ntet");
              ref_grid_ptr_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x237,"ref_import_bin_ugrid",(ulong)uVar1,"nqua");
            ref_grid_ptr_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x236,"ref_import_bin_ugrid",(ulong)uVar1,"ntri");
          ref_grid_ptr_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x235,"ref_import_bin_ugrid",(ulong)uVar1,"nnode");
        ref_grid_ptr_local._4_4_ = uVar1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x22d,
           "ref_import_bin_ugrid",(ulong)uVar1,"create grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi,
                                               const char *filename,
                                               REF_BOOL swap, REF_BOOL fat) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;

  REF_INT node, new_node;
  REF_INT max_chunk, nread, chunk, ixyz;
  REF_DBL *xyz;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nnode), "nnode");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntri), "ntri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nqua), "nqua");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &ntet), "ntet");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npyr), "npyr");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &npri), "npri");
  RSS(ref_import_bin_ugrid_chunk(file, swap, fat, 1, &nhex), "nhex");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  /* large block reads recommended for IO performance */
  max_chunk = MIN(1000000, nnode);
  ref_malloc(xyz, 3 * max_chunk, REF_DBL);
  nread = 0;
  while (nread < nnode) {
    chunk = MIN(max_chunk, nnode - nread);
    REIS(3 * chunk, fread(xyz, sizeof(REF_DBL), (size_t)(3 * chunk), file),
         "xyz");
    if (swap)
      for (ixyz = 0; ixyz < 3 * chunk; ixyz++) SWAP_DBL(xyz[ixyz]);
    for (node = 0; node < chunk; node++) {
      RSS(ref_node_add(ref_node, node + nread, &new_node), "new_node");
      ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
      ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
      ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
    }
    nread += chunk;
  }
  ref_free(xyz);

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tri(ref_grid), ntri, file, swap, fat),
      "tri face nodes");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_qua(ref_grid), nqua, file, swap, fat),
      "qua face nodes");

  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_tri(ref_grid), ntri, file, swap,
                                     fat),
      "tri face tags");
  RSS(ref_import_bin_ugrid_bound_tag(ref_grid_qua(ref_grid), nqua, file, swap,
                                     fat),
      "tri face tags");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tri");

  RSS(ref_import_bin_ugrid_c2n(ref_grid_tet(ref_grid), ntet, file, swap, fat),
      "tet face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tet");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pyr(ref_grid), npyr, file, swap, fat),
      "pyr face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pyr");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_pri(ref_grid), npri, file, swap, fat),
      "pri face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pri");
  RSS(ref_import_bin_ugrid_c2n(ref_grid_hex(ref_grid), nhex, file, swap, fat),
      "hex face nodes");
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid hex");

  fclose(file);

  return REF_SUCCESS;
}